

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TransitionModelMapping.cpp
# Opt level: O2

void __thiscall TransitionModelMapping::~TransitionModelMapping(TransitionModelMapping *this)

{
  matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
  *pmVar1;
  pointer ppmVar2;
  pointer ppmVar3;
  
  (this->super_TransitionModelDiscrete).super_TransitionModelDiscreteInterface.super_TransitionModel
  ._vptr_TransitionModel = (_func_int **)&PTR__TransitionModelMapping_00606c60;
  for (ppmVar3 = (this->_m_T).
                 super__Vector_base<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_std::allocator<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      ppmVar3 !=
      (this->_m_T).
      super__Vector_base<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_std::allocator<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*>_>
      ._M_impl.super__Vector_impl_data._M_finish; ppmVar3 = ppmVar3 + 1) {
    pmVar1 = *ppmVar3;
    if (pmVar1 != (matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
                   *)0x0) {
      boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>::~unbounded_array
                (&pmVar1->data_);
    }
    operator_delete(pmVar1,0x28);
  }
  ppmVar2 = (this->_m_T).
            super__Vector_base<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_std::allocator<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (ppmVar3 != ppmVar2) {
    (this->_m_T).
    super__Vector_base<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_std::allocator<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*>_>
    ._M_impl.super__Vector_impl_data._M_finish = ppmVar2;
  }
  std::
  _Vector_base<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_std::allocator<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*>_>
  ::~_Vector_base(&(this->_m_T).
                   super__Vector_base<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_std::allocator<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*>_>
                 );
  TransitionModelDiscrete::~TransitionModelDiscrete(&this->super_TransitionModelDiscrete);
  return;
}

Assistant:

TransitionModelMapping::~TransitionModelMapping()
{    
    for(vector<Matrix*>::iterator it=_m_T.begin();
        it!=_m_T.end(); ++it)
        delete(*it);
    _m_T.clear();
}